

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

void __thiscall
duckdb::WindowHashGroup::WindowHashGroup
          (WindowHashGroup *this,WindowGlobalSinkState *gstate,idx_t hash_bin_p)

{
  RowLayout *this_00;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  BoundWindowExpression *pBVar3;
  _Hash_node_base *p_Var4;
  _Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> _Var5;
  _Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  __ptr_00;
  WindowCollection *__ptr_01;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  reference pvVar10;
  pointer pPVar11;
  atomic<unsigned_long> *paVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  unsigned_long uVar14;
  pointer pWVar15;
  mapped_type *pmVar16;
  pointer pRVar17;
  type swizzled_block_collection;
  type swizzled_string_heap;
  type block_collection;
  type string_heap;
  pointer pGVar18;
  BufferManager *buffer_manager;
  WindowCollection *this_02;
  pointer *__ptr_3;
  ulong uVar19;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_03;
  pointer *__ptr;
  ulong uVar20;
  unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true> *wexec;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  pointer this_04;
  buffer_ptr<ValidityBuffer> *pbVar22;
  optional_ptr<const_duckdb::Expression,_true> *expr;
  pointer this_05;
  pointer *__ptr_2;
  vector<duckdb::LogicalType,_true> types;
  OrderMasks *__range2;
  undefined1 local_c8 [64];
  vector<duckdb::LogicalType,_true> local_88;
  __native_type local_70;
  vector<duckdb::LogicalType,_true> local_48;
  
  local_c8._32_8_ = &this->rows;
  local_70._8_8_ = &this->heap;
  this_00 = &this->layout;
  this->blocks = 0;
  (this->rows).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->hash_group).
  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
       (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)0x0;
  this->count = 0;
  (this->heap).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  RowLayout::RowLayout(this_00);
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  local_70.__data.__list.__prev = (__pthread_internal_list *)&this->order_masks;
  (this->order_masks)._M_h._M_buckets = &(this->order_masks)._M_h._M_single_bucket;
  (this->order_masks)._M_h._M_bucket_count = 1;
  (this->order_masks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->order_masks)._M_h._M_element_count = 0;
  (this->order_masks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stage)._M_i = SINK;
  (this->order_masks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->order_masks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->collection).
  super_unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
  .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl = (WindowCollection *)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->hash_bin = hash_bin_p;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->next_task = 0;
  (this->sunk).super___atomic_base<unsigned_long>._M_i = 0;
  (this->finalized).super___atomic_base<unsigned_long>._M_i = 0;
  (this->completed).super___atomic_base<unsigned_long>._M_i = 0;
  this->batch_base = 0;
  local_70._16_8_ = gstate;
  local_c8._56_8_ =
       unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
       ::operator*(&gstate->global_partition);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,
             &(((type)local_c8._56_8_)->super_PartitionGlobalSinkState).payload_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(this_00,&local_48,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  uVar20 = this->hash_bin;
  local_70.__data.__list.__next =
       (__pthread_internal_list *)&((PartitionGlobalSinkState *)local_c8._56_8_)->hash_groups;
  if (uVar20 < (ulong)((long)(((PartitionGlobalSinkState *)local_c8._56_8_)->hash_groups).
                             super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(((PartitionGlobalSinkState *)local_c8._56_8_)->hash_groups).
                             super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pvVar10 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                            *)local_70.__data.__list.__next,uVar20);
    uVar20 = this->hash_bin;
    if ((pvVar10->
        super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl !=
        (PartitionGlobalHashGroup *)0x0) {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                              *)local_70.__data.__list.__next,uVar20);
      pPVar11 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                ::operator->(pvVar10);
      paVar12 = &pPVar11->count;
      goto LAB_00b6cebc;
    }
  }
  if (uVar20 != 0 ||
      (((PartitionGlobalSinkState *)local_c8._56_8_)->rows).
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
      (RowDataCollection *)0x0) {
    return;
  }
  paVar12 = &((PartitionGlobalSinkState *)local_c8._56_8_)->count;
LAB_00b6cebc:
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(paVar12->super___atomic_base<unsigned_long>)._M_i;
  this->count = (idx_t)local_88.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity =
       (idx_t)local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start;
  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
            ((duckdb *)local_c8,(unsigned_long *)&local_88);
  uVar9 = local_c8._8_8_;
  uVar6 = local_c8._0_8_;
  pbVar22 = &(this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  p_Var1 = (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar6;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     (pointer)local_c8._8_8_ != (pointer)0x0)) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(pbVar22);
  local_70.__align = (long)&this->partition_mask;
  _Var21._M_head_impl =
       (pTVar13->owned_data).
       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       _Var21._M_head_impl;
  uVar20 = this->count;
  local_c8._48_8_ = this_00;
  if (_Var21._M_head_impl == (unsigned_long *)0x0) {
    local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)local_c8,(unsigned_long *)&local_88);
    uVar9 = local_c8._8_8_;
    uVar6 = local_c8._0_8_;
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    p_Var1 = (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.
             internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar6;
    (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       (pointer)local_c8._8_8_ != (pointer)0x0)) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(pbVar22);
    _Var21._M_head_impl =
         (pTVar13->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    *(unsigned_long **)local_70.__align = _Var21._M_head_impl;
  }
  if (uVar20 != 0) {
    uVar19 = uVar20 + 0x3f >> 6;
    if (uVar19 != 1) {
      switchD_00569a20::default(_Var21._M_head_impl,0,uVar19 * 8 - 8);
    }
    uVar14 = -1L << ((byte)uVar20 & 0x3f);
    if ((uVar20 & 0x3f) == 0) {
      uVar14 = 0;
    }
    _Var21._M_head_impl[uVar19 - 1] = uVar14;
  }
  puVar2 = *(pointer *)(local_70._16_8_ + 0x78);
  local_c8._24_8_ = &this->collection;
  local_c8._40_8_ = this;
  for (this_04 = (((Executors *)(local_70._16_8_ + 0x70))->
                 super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; uVar8 = local_c8._56_8_,
      uVar9 = local_c8._40_8_, uVar6 = local_c8._24_8_, this_04 != puVar2; this_04 = this_04 + 1) {
    pWVar15 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>
              ::operator->(this_04);
    pBVar3 = pWVar15->wexpr;
    local_c8._0_8_ =
         ((long)(pBVar3->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pBVar3->orders).
                super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
                super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
         ((long)(pBVar3->partitions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pBVar3->partitions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
    pmVar16 = ::std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_70.__data.__list.__prev,(key_type *)local_c8);
    if ((pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0)
    {
      local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(local_c8._40_8_ + 8);
      (pmVar16->super_TemplatedValidityMask<unsigned_long>).capacity =
           (idx_t)local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_c8,(unsigned_long *)&local_88);
      uVar9 = local_c8._8_8_;
      uVar6 = local_c8._0_8_;
      local_c8._0_8_ = (pointer)0x0;
      local_c8._8_8_ = (pointer)0x0;
      p_Var1 = (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
      if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
         (pointer)local_c8._8_8_ != (pointer)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      pbVar22 = &(pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data;
      pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(pbVar22);
      _Var21._M_head_impl =
           (pTVar13->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
      uVar20 = *(idx_t *)(local_c8._40_8_ + 8);
      if (_Var21._M_head_impl == (unsigned_long *)0x0) {
        local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(pmVar16->super_TemplatedValidityMask<unsigned_long>).capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_c8,(unsigned_long *)&local_88);
        uVar9 = local_c8._8_8_;
        uVar6 = local_c8._0_8_;
        local_c8._0_8_ = (pointer)0x0;
        local_c8._8_8_ = (pointer)0x0;
        p_Var1 = (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)uVar6;
        (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
           (pointer)local_c8._8_8_ != (pointer)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
        pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            (pbVar22);
        _Var21._M_head_impl =
             (pTVar13->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        (pmVar16->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var21._M_head_impl;
      }
      if (uVar20 != 0) {
        uVar19 = uVar20 + 0x3f >> 6;
        if (uVar19 != 1) {
          switchD_00569a20::default(_Var21._M_head_impl,0,uVar19 * 8 - 8);
        }
        uVar14 = -1L << ((byte)uVar20 & 0x3f);
        if ((uVar20 & 0x3f) == 0) {
          uVar14 = 0;
        }
        _Var21._M_head_impl[uVar19 - 1] = uVar14;
      }
    }
  }
  *(bool *)(local_c8._40_8_ + 0xe0) = ((PartitionGlobalSinkState *)local_c8._56_8_)->external;
  uVar20 = *(idx_t *)(local_c8._40_8_ + 0x118);
  if ((((PartitionGlobalSinkState *)local_c8._56_8_)->rows).
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
      (RowDataCollection *)0x0 || uVar20 != 0) {
    if (uVar20 < (ulong)((long)(((PartitionGlobalSinkState *)local_c8._56_8_)->hash_groups).
                               super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(((PartitionGlobalSinkState *)local_c8._56_8_)->hash_groups).
                               super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar10 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                              *)local_70.__data.__list.__next,uVar20);
      _Var5._M_head_impl =
           (pvVar10->
           super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
      (pvVar10->
      super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
           (PartitionGlobalHashGroup *)0x0;
      __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
           (((HashGroupPtr *)uVar9)->
           super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>;
      (((HashGroupPtr *)uVar9)->
      super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
      .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
           (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)_Var5._M_head_impl;
      if (__ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl !=
          (PartitionGlobalHashGroup *)0x0) {
        ::std::default_delete<duckdb::PartitionGlobalHashGroup>::operator()
                  ((default_delete<duckdb::PartitionGlobalHashGroup> *)uVar9,
                   (PartitionGlobalHashGroup *)
                   __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>.
                   _M_head_impl);
      }
      pPVar11 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                ::operator->((unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                              *)uVar9);
      PartitionGlobalHashGroup::ComputeMasks
                (pPVar11,(ValidityMask *)local_70.__align,
                 (OrderMasks *)local_70.__data.__list.__prev);
      pPVar11 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                ::operator->((unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
                              *)uVar9);
      pGVar18 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->(&pPVar11->global_sort);
      *(bool *)(uVar9 + 0xe0) = pGVar18->external;
      MaterializeSortedData((WindowHashGroup *)uVar9);
    }
  }
  else {
    **(unsigned_long **)local_70.__align = **(unsigned_long **)local_70.__align | 1;
    this_01 = &((PartitionGlobalSinkState *)local_c8._56_8_)->rows;
    for (p_Var4 = (((OrderMasks *)(local_c8._40_8_ + 0xa0))->_M_h)._M_before_begin._M_nxt;
        p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
      (p_Var4[2]._M_nxt)->_M_nxt = (_Hash_node_base *)((ulong)(p_Var4[2]._M_nxt)->_M_nxt | 1);
    }
    pRVar17 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_01);
    unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>::
    operator->(this_01);
    RowDataCollection::CloneEmpty((RowDataCollection *)local_c8,SUB81(pRVar17,0));
    uVar7 = local_c8._0_8_;
    local_c8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)local_c8._32_8_,(pointer)uVar7);
    uVar7 = local_c8._0_8_;
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 (local_c8._0_8_ + 0x38));
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 *)(uVar7 + 0x20));
      operator_delete((void *)uVar7);
    }
    this_03 = &((PartitionGlobalSinkState *)uVar8)->strings;
    pRVar17 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_03);
    unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>::
    operator->(this_03);
    RowDataCollection::CloneEmpty((RowDataCollection *)local_c8,SUB81(pRVar17,0));
    uVar8 = local_c8._0_8_;
    local_c8._0_8_ = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)local_70._8_8_,(pointer)uVar8);
    uVar8 = local_c8._0_8_;
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 (local_c8._0_8_ + 0x38));
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 *)(uVar8 + 0x20));
      operator_delete((void *)uVar8);
    }
    swizzled_block_collection =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                      *)local_c8._32_8_);
    swizzled_string_heap =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                      *)local_70._8_8_);
    block_collection =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*(this_01);
    string_heap = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator*(this_03);
    RowDataCollectionScanner::AlignHeapBlocks
              (swizzled_block_collection,swizzled_string_heap,block_collection,string_heap,
               (RowLayout *)local_c8._48_8_);
    *(bool *)(uVar9 + 0xe0) = true;
  }
  if ((((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_> *)
       local_c8._32_8_)->_M_t).
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (RowDataCollection *)0x0) {
    pRVar17 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                            *)local_c8._32_8_);
    *(long *)(uVar9 + 0x10) =
         (long)(pRVar17->blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pRVar17->blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  WindowSharedExpressions::GetSortedExpressions
            ((vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *)local_c8,
             (Shared *)(local_70._16_8_ + 0x88));
  uVar8 = local_c8._8_8_;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_c8._0_8_ != local_c8._8_8_) {
    this_05 = (pointer)local_c8._0_8_;
    do {
      optional_ptr<const_duckdb::Expression,_true>::CheckValid
                ((optional_ptr<const_duckdb::Expression,_true> *)this_05);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_88,
                 (LogicalType *)
                 ((long)(((unsafe_unique_array<unsigned_long> *)&this_05->buffer_manager)->
                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>).
                        _M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                        _M_t + 0x38));
      this_05 = (pointer)&this_05->count;
    } while (this_05 != (pointer)uVar8);
  }
  buffer_manager = BufferManager::GetBufferManager(*(ClientContext **)(local_70._16_8_ + 0x60));
  this_02 = (WindowCollection *)operator_new(0xb8);
  WindowCollection::WindowCollection(this_02,buffer_manager,*(idx_t *)(uVar9 + 8),&local_88);
  __ptr_01 = *(WindowCollection **)uVar6;
  *(WindowCollection **)uVar6 = this_02;
  if (__ptr_01 != (WindowCollection *)0x0) {
    ::std::default_delete<duckdb::WindowCollection>::operator()
              ((default_delete<duckdb::WindowCollection> *)uVar6,__ptr_01);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_);
  }
  return;
}

Assistant:

WindowHashGroup::WindowHashGroup(WindowGlobalSinkState &gstate, const idx_t hash_bin_p)
    : count(0), blocks(0), stage(WindowGroupStage::SINK), hash_bin(hash_bin_p), sunk(0), finalized(0), completed(0),
      batch_base(0) {
	// There are three types of partitions:
	// 1. No partition (no sorting)
	// 2. One partition (sorting, but no hashing)
	// 3. Multiple partitions (sorting and hashing)

	//	How big is the partition?
	auto &gpart = *gstate.global_partition;
	layout.Initialize(gpart.payload_types);
	if (hash_bin < gpart.hash_groups.size() && gpart.hash_groups[hash_bin]) {
		count = gpart.hash_groups[hash_bin]->count;
	} else if (gpart.rows && !hash_bin) {
		count = gpart.count;
	} else {
		return;
	}

	//	Initialise masks to false
	partition_mask.Initialize(count);
	partition_mask.SetAllInvalid(count);

	const auto &executors = gstate.executors;
	for (auto &wexec : executors) {
		auto &wexpr = wexec->wexpr;
		auto &order_mask = order_masks[wexpr.partitions.size() + wexpr.orders.size()];
		if (order_mask.IsMaskSet()) {
			continue;
		}
		order_mask.Initialize(count);
		order_mask.SetAllInvalid(count);
	}

	// Scan the sorted data into new Collections
	external = gpart.external;
	if (gpart.rows && !hash_bin) {
		// Simple mask
		partition_mask.SetValidUnsafe(0);
		for (auto &order_mask : order_masks) {
			order_mask.second.SetValidUnsafe(0);
		}
		//	No partition - align the heap blocks with the row blocks
		rows = gpart.rows->CloneEmpty(gpart.rows->keep_pinned);
		heap = gpart.strings->CloneEmpty(gpart.strings->keep_pinned);
		RowDataCollectionScanner::AlignHeapBlocks(*rows, *heap, *gpart.rows, *gpart.strings, layout);
		external = true;
	} else if (hash_bin < gpart.hash_groups.size()) {
		// Overwrite the collections with the sorted data
		D_ASSERT(gpart.hash_groups[hash_bin].get());
		hash_group = std::move(gpart.hash_groups[hash_bin]);
		hash_group->ComputeMasks(partition_mask, order_masks);
		external = hash_group->global_sort->external;
		MaterializeSortedData();
	}

	if (rows) {
		blocks = rows->blocks.size();
	}

	// Set up the collection for any fully materialised data
	const auto &shared = WindowSharedExpressions::GetSortedExpressions(gstate.shared.coll_shared);
	vector<LogicalType> types;
	for (auto &expr : shared) {
		types.emplace_back(expr->return_type);
	}
	auto &buffer_manager = BufferManager::GetBufferManager(gstate.context);
	collection = make_uniq<WindowCollection>(buffer_manager, count, types);
}